

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O1

bool absl::lts_20240722::flags_internal::AbslParseFlag(string_view text,bool *dst,string *param_3)

{
  char cVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  string_view sVar11;
  
  sVar11._M_len = text._M_str;
  sVar11._M_str = dst;
  sVar11 = StripLeadingAsciiWhitespace((lts_20240722 *)text._M_len,sVar11);
  pcVar6 = sVar11._M_str;
  uVar2 = sVar11._M_len;
  pcVar5 = pcVar6 + uVar2;
  pcVar8 = pcVar5;
  if (0 < (long)uVar2 >> 2) {
    pcVar8 = pcVar6 + ((uint)sVar11._M_len & 3);
    lVar7 = ((long)uVar2 >> 2) + 1;
    do {
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar5[-1]) & 8) == 0)
      goto LAB_0010463b;
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar5[-2]) & 8) == 0) {
        pcVar5 = pcVar5 + -1;
        goto LAB_0010463b;
      }
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar5[-3]) & 8) == 0) {
        pcVar5 = pcVar5 + -2;
        goto LAB_0010463b;
      }
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar5[-4]) & 8) == 0) {
        pcVar5 = pcVar5 + -3;
        goto LAB_0010463b;
      }
      pcVar5 = pcVar5 + -4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = (long)pcVar8 - (long)pcVar6;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pcVar5 = pcVar6;
      if ((lVar7 != 3) ||
         (pcVar5 = pcVar8,
         (*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar8[-1]) & 8) == 0))
      goto LAB_0010463b;
      pcVar8 = pcVar8 + -1;
    }
    pcVar5 = pcVar8;
    if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar8[-1]) & 8) == 0)
    goto LAB_0010463b;
    pcVar8 = pcVar8 + -1;
  }
  pcVar5 = pcVar8;
  if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar8[-1]) & 8) != 0) {
    pcVar5 = pcVar6;
  }
LAB_0010463b:
  uVar9 = (long)pcVar5 - (long)pcVar6;
  if (uVar2 < (ulong)((long)pcVar5 - (long)pcVar6)) {
    uVar9 = uVar2;
  }
  lVar7 = 0;
  bVar10 = true;
  uVar2 = 0;
  do {
    pcVar5 = *(char **)((long)&PTR_anon_var_dwarf_3e_00109ca0 + lVar7);
    sVar3 = strlen(pcVar5);
    cVar1 = absl::lts_20240722::EqualsIgnoreCase(uVar9,pcVar6,sVar3,pcVar5);
    if (cVar1 != '\0') {
      bVar4 = true;
LAB_001046be:
      *dst = bVar4;
      return bVar10;
    }
    sVar3 = strlen(*(char **)((long)&PTR_anon_var_dwarf_a1_00109cd0 + lVar7));
    cVar1 = absl::lts_20240722::EqualsIgnoreCase(uVar9,pcVar6,sVar3);
    if (cVar1 != '\0') {
      bVar4 = false;
      goto LAB_001046be;
    }
    bVar10 = uVar2 < 4;
    uVar2 = uVar2 + 1;
    lVar7 = lVar7 + 8;
    if (uVar2 == 5) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool AbslParseFlag(absl::string_view text, bool* dst, std::string*) {
  const char* kTrue[] = {"1", "t", "true", "y", "yes"};
  const char* kFalse[] = {"0", "f", "false", "n", "no"};
  static_assert(sizeof(kTrue) == sizeof(kFalse), "true_false_equal");

  text = absl::StripAsciiWhitespace(text);

  for (size_t i = 0; i < ABSL_ARRAYSIZE(kTrue); ++i) {
    if (absl::EqualsIgnoreCase(text, kTrue[i])) {
      *dst = true;
      return true;
    } else if (absl::EqualsIgnoreCase(text, kFalse[i])) {
      *dst = false;
      return true;
    }
  }
  return false;  // didn't match a legal input
}